

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O0

void __thiscall cmCTestConfigureCommand::cmCTestConfigureCommand(cmCTestConfigureCommand *this)

{
  reference ppcVar1;
  cmCTestConfigureCommand *this_local;
  
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestConfigureCommand_00d9d520;
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,7);
  *ppcVar1 = "OPTIONS";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,8);
  *ppcVar1 = (value_type)0x0;
  (this->super_cmCTestHandlerCommand).Last = 8;
  return;
}

Assistant:

cmCTestConfigureCommand::cmCTestConfigureCommand()
{
  this->Arguments[ctc_OPTIONS] = "OPTIONS";
  this->Arguments[ctc_LAST] = CM_NULLPTR;
  this->Last = ctc_LAST;
}